

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_config(sqlite3 *db,int op,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_RCX;
  char *in_RDX;
  int in_ESI;
  sqlite3 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  u64 oldFlags;
  int *pRes;
  int onoff;
  uint i;
  int cnt;
  int sz;
  void *pBuf;
  int rc;
  va_list ap;
  undefined8 *local_1a8;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  void *in_stack_fffffffffffffe70;
  sqlite3 *in_stack_fffffffffffffe78;
  undefined8 *local_178;
  undefined8 *local_160;
  undefined8 local_118 [2];
  char *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  u64 local_60;
  uint *local_58;
  int local_50;
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  char *local_40;
  int local_38;
  int local_34;
  sqlite3 *local_30;
  undefined1 *local_28;
  undefined8 *puStack_20;
  undefined8 *local_18;
  long local_8;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Da;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_34 = in_ESI;
  local_30 = in_RDI;
  sqlite3_mutex_enter((sqlite3_mutex *)0x14a55c);
  local_18 = local_118;
  local_28 = (undefined1 *)0x3000000010;
  puStack_20 = (undefined8 *)&stack0x00000008;
  if (local_34 == 1000) {
    local_28._0_4_ = 0x18;
    local_30->aDb->zDbSName = local_108;
    local_38 = 0;
  }
  else if (local_34 == 0x3e9) {
    local_28._0_4_ = 0x18;
    local_40 = local_108;
    if ((uint)local_28 < 0x29) {
      lVar1 = (long)(int)(uint)local_28;
      local_28._0_4_ = (uint)local_28 + 8;
      local_160 = (undefined8 *)((long)local_18 + lVar1);
    }
    else {
      puStack_20 = (undefined8 *)&stack0x00000010;
      local_160 = (undefined8 *)&stack0x00000008;
    }
    local_44 = *(undefined4 *)local_160;
    if ((uint)local_28 < 0x29) {
      local_178 = (undefined8 *)((long)local_18 + (long)(int)(uint)local_28);
      local_28._0_4_ = (uint)local_28 + 8;
    }
    else {
      local_178 = puStack_20;
      puStack_20 = puStack_20 + 1;
    }
    local_48 = *(undefined4 *)local_178;
    local_38 = setupLookaside(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                              in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
  }
  else {
    local_38 = 1;
    for (local_4c = 0; local_4c < 0x15; local_4c = local_4c + 1) {
      if (sqlite3_db_config::aFlagOp[local_4c].op == local_34) {
        local_28._0_4_ = 0x18;
        local_38 = 1;
        local_50 = (int)local_108;
        if ((uint)local_28 < 0x29) {
          lVar1 = (long)(int)(uint)local_28;
          local_28._0_4_ = (uint)local_28 + 8;
          local_1a8 = (undefined8 *)((long)local_18 + lVar1);
        }
        else {
          puStack_20 = (undefined8 *)&stack0x00000010;
          local_1a8 = (undefined8 *)&stack0x00000008;
        }
        local_58 = (uint *)*local_1a8;
        local_60 = local_30->flags;
        if ((int)local_108 < 1) {
          if ((int)local_108 == 0) {
            local_30->flags =
                 (sqlite3_db_config::aFlagOp[local_4c].mask ^ 0xffffffffffffffff) & local_30->flags;
          }
        }
        else {
          local_30->flags = sqlite3_db_config::aFlagOp[local_4c].mask | local_30->flags;
        }
        if (local_60 != local_30->flags) {
          sqlite3ExpirePreparedStatements(local_30,0);
        }
        if (local_58 != (uint *)0x0) {
          *local_58 = (uint)((local_30->flags & sqlite3_db_config::aFlagOp[local_4c].mask) != 0);
        }
        local_38 = 0;
        break;
      }
    }
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x14a9ea);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_db_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  va_start(ap, op);
  switch( op ){
    case SQLITE_DBCONFIG_MAINDBNAME: {
      /* IMP: R-06824-28531 */
      /* IMP: R-36257-52125 */
      db->aDb[0].zDbSName = va_arg(ap,char*);
      rc = SQLITE_OK;
      break;
    }
    case SQLITE_DBCONFIG_LOOKASIDE: {
      void *pBuf = va_arg(ap, void*); /* IMP: R-26835-10964 */
      int sz = va_arg(ap, int);       /* IMP: R-47871-25994 */
      int cnt = va_arg(ap, int);      /* IMP: R-04460-53386 */
      rc = setupLookaside(db, pBuf, sz, cnt);
      break;
    }
    default: {
      static const struct {
        int op;      /* The opcode */
        u64 mask;    /* Mask of the bit in sqlite3.flags to set/clear */
      } aFlagOp[] = {
        { SQLITE_DBCONFIG_ENABLE_FKEY,           SQLITE_ForeignKeys    },
        { SQLITE_DBCONFIG_ENABLE_TRIGGER,        SQLITE_EnableTrigger  },
        { SQLITE_DBCONFIG_ENABLE_VIEW,           SQLITE_EnableView     },
        { SQLITE_DBCONFIG_ENABLE_FTS3_TOKENIZER, SQLITE_Fts3Tokenizer  },
        { SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION, SQLITE_LoadExtension  },
        { SQLITE_DBCONFIG_NO_CKPT_ON_CLOSE,      SQLITE_NoCkptOnClose  },
        { SQLITE_DBCONFIG_ENABLE_QPSG,           SQLITE_EnableQPSG     },
        { SQLITE_DBCONFIG_TRIGGER_EQP,           SQLITE_TriggerEQP     },
        { SQLITE_DBCONFIG_RESET_DATABASE,        SQLITE_ResetDatabase  },
        { SQLITE_DBCONFIG_DEFENSIVE,             SQLITE_Defensive      },
        { SQLITE_DBCONFIG_WRITABLE_SCHEMA,       SQLITE_WriteSchema|
                                                 SQLITE_NoSchemaError  },
        { SQLITE_DBCONFIG_LEGACY_ALTER_TABLE,    SQLITE_LegacyAlter    },
        { SQLITE_DBCONFIG_DQS_DDL,               SQLITE_DqsDDL         },
        { SQLITE_DBCONFIG_DQS_DML,               SQLITE_DqsDML         },
        { SQLITE_DBCONFIG_LEGACY_FILE_FORMAT,    SQLITE_LegacyFileFmt  },
        { SQLITE_DBCONFIG_TRUSTED_SCHEMA,        SQLITE_TrustedSchema  },
        { SQLITE_DBCONFIG_STMT_SCANSTATUS,       SQLITE_StmtScanStatus },
        { SQLITE_DBCONFIG_REVERSE_SCANORDER,     SQLITE_ReverseOrder   },
        { SQLITE_DBCONFIG_ENABLE_ATTACH_CREATE,  SQLITE_AttachCreate   },
        { SQLITE_DBCONFIG_ENABLE_ATTACH_WRITE,   SQLITE_AttachWrite    },
        { SQLITE_DBCONFIG_ENABLE_COMMENTS,       SQLITE_Comments       },
      };
      unsigned int i;
      rc = SQLITE_ERROR; /* IMP: R-42790-23372 */
      for(i=0; i<ArraySize(aFlagOp); i++){
        if( aFlagOp[i].op==op ){
          int onoff = va_arg(ap, int);
          int *pRes = va_arg(ap, int*);
          u64 oldFlags = db->flags;
          if( onoff>0 ){
            db->flags |= aFlagOp[i].mask;
          }else if( onoff==0 ){
            db->flags &= ~(u64)aFlagOp[i].mask;
          }
          if( oldFlags!=db->flags ){
            sqlite3ExpirePreparedStatements(db, 0);
          }
          if( pRes ){
            *pRes = (db->flags & aFlagOp[i].mask)!=0;
          }
          rc = SQLITE_OK;
          break;
        }
      }
      break;
    }
  }
  va_end(ap);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}